

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O3

void __thiscall QToolBar::clear(QToolBar *this)

{
  undefined1 *puVar1;
  long in_FS_OFFSET;
  QList<QAction_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::actions(&local_38,&this->super_QWidget);
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    puVar1 = (undefined1 *)0x0;
    do {
      QWidget::removeAction(&this->super_QWidget,local_38.d.ptr[(long)puVar1]);
      puVar1 = puVar1 + 1;
    } while (puVar1 < (ulong)local_38.d.size);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::clear()
{
    QList<QAction *> actions = this->actions();
    for(int i = 0; i < actions.size(); i++)
        removeAction(actions.at(i));
}